

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::Lex::MakeNFA
          (Lex *this,NFA *nfa,String *regExp,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
          *macroNFAs)

{
  undefined1 *this_00;
  RegExprNFAParseHandler *this_01;
  bool bVar1;
  RegExprNFAParseElement *pRVar2;
  String local_408;
  allocator<char> local_3e1;
  String local_3e0;
  allocator<char> local_3b9;
  String local_3b8;
  undefined1 local_398 [8];
  ParseMessage msg;
  RegExprNFAParseHandler parseHandler;
  Parse<SGParser::Generator::RegExprNFAParseElement> parse;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  MemBufferInputStream inputStream;
  undefined1 local_190 [8];
  Grammar grammar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *macroNFAs_local;
  String *regExp_local;
  NFA *nfa_local;
  Lex *this_local;
  
  grammar.Messages.pMessages = (Messages *)macroNFAs;
  bVar1 = ParseTable::IsValid(&(this->NFAParseTable).super_ParseTable);
  if (!bVar1) {
    Grammar::Grammar((Grammar *)local_190);
    CreateRegExpGrammar(this,(Grammar *)local_190);
    bVar1 = ParseTableGen::Create(&this->NFAParseTable,(Grammar *)local_190,CLR);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    Grammar::~Grammar((Grammar *)local_190);
    if (!bVar1) goto LAB_0018e863;
  }
  this_00 = &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38;
  MemBufferInputStream::MemBufferInputStream((MemBufferInputStream *)this_00,regExp);
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8),(InputStream *)this_00);
  Parse<SGParser::Generator::RegExprNFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs,
             &(this->NFAParseTable).super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8),0x800);
  this_01 = (RegExprNFAParseHandler *)((long)&msg.FileName.field_2 + 8);
  RegExprNFAParseHandler::RegExprNFAParseHandler(this_01);
  parseHandler.super_ParseHandler<SGParser::Generator::RegExprNFAParseElement>._vptr_ParseHandler.
  _0_4_ = NFA::GetLexemeID(nfa);
  parseHandler.pLex = (Lex *)grammar.Messages.pMessages;
  parseHandler._8_8_ = this;
  this_local._7_1_ =
       Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
                 ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs,
                  (ParseHandler<SGParser::Generator::RegExprNFAParseElement> *)this_01);
  if ((bool)this_local._7_1_) {
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        &parseHandler.pMacroNFAs,0);
    NFA::MoveData(nfa,(pRVar2->field_1).pNFA);
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        &parseHandler.pMacroNFAs,0);
    RegExprNFAParseElement::Destroy(pRVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"NFA: Regular expression parsing error",&local_3e1);
    std::__cxx11::string::string((string *)&local_408);
    ParseMessage::ParseMessage
              ((ParseMessage *)local_398,ErrorMessage,&local_3b8,&local_3e0,0,0xffffffffffffffff,
               0xffffffffffffffff,&local_408,0);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)local_398);
    ParseMessage::~ParseMessage((ParseMessage *)local_398);
  }
  RegExprNFAParseHandler::~RegExprNFAParseHandler
            ((RegExprNFAParseHandler *)((long)&msg.FileName.field_2 + 8));
  Parse<SGParser::Generator::RegExprNFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs);
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::~RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8));
  MemBufferInputStream::~MemBufferInputStream
            ((MemBufferInputStream *)
             &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
LAB_0018e863:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Lex::MakeNFA(NFA& nfa, const String& regExp, std::map<String, NFA*>& macroNFAs) {
    if (!NFAParseTable.IsValid()) {
        // Create the hard coded Regular Expression grammar
        Grammar grammar;
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!NFAParseTable.Create(grammar))
            return false;  // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExp};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprNFAParseElement> parse{&NFAParseTable, &tokenizer};
    RegExprNFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID   = nfa.GetLexemeID();
    parseHandler.pLex       = this;
    parseHandler.pMacroNFAs = &macroNFAs;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "NFA: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Move result NFA data over to us, and destroy result NFA
    nfa.MoveData(*parse[0].pNFA);
    parse[0].Destroy();

    return true;
}